

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_icu.cpp
# Opt level: O3

bool qt_u_strToCase(QString *str,QString *out,char *localeID,Ptr_u_strToCase caseFunc)

{
  int iVar1;
  int32_t iVar2;
  char16_t *pcVar3;
  bool bVar4;
  undefined1 *size;
  long in_FS_OFFSET;
  UErrorCode status;
  UErrorCode local_4c;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (int)(str->d).size;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(&local_48,(long)((iVar1 >> 2) + iVar1),Uninitialized);
  local_4c = U_ZERO_ERROR;
  if ((&(local_48.d.d)->super_QArrayData == (QArrayData *)0x0) ||
     (1 < ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(&local_48,local_48.d.size,KeepSize);
  }
  pcVar3 = (str->d).ptr;
  if (pcVar3 == (UChar_conflict *)0x0) {
    pcVar3 = &QString::_empty;
  }
  iVar2 = (*caseFunc)(local_48.d.ptr,(int32_t)local_48.d.size,pcVar3,(int32_t)(str->d).size,localeID
                      ,&local_4c);
  if (local_4c < U_ILLEGAL_ARGUMENT_ERROR || local_4c == U_BUFFER_OVERFLOW_ERROR) {
    size = (undefined1 *)(long)iVar2;
    if ((long)size < local_48.d.size) {
      QString::resize(&local_48,(qsizetype)size);
    }
    else if ((ulong)local_48.d.size < size) {
      QString::resize(&local_48,(qsizetype)size);
      local_4c = U_ZERO_ERROR;
      if ((&(local_48.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QString::reallocData(&local_48,local_48.d.size,KeepSize);
      }
      pcVar3 = (str->d).ptr;
      if (pcVar3 == (UChar_conflict *)0x0) {
        pcVar3 = &QString::_empty;
      }
      iVar2 = (*caseFunc)(local_48.d.ptr,(int32_t)local_48.d.size,pcVar3,(int32_t)(str->d).size,
                          localeID,&local_4c);
      if ((U_ZERO_ERROR < local_4c) || ((undefined1 *)local_48.d.size != (undefined1 *)(long)iVar2))
      goto LAB_003ee996;
    }
    QString::operator=(out,&local_48);
    bVar4 = true;
  }
  else {
LAB_003ee996:
    bVar4 = false;
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool qt_u_strToCase(const QString &str, QString *out, const char *localeID, Ptr_u_strToCase caseFunc)
{
    Q_ASSERT(out);

    int32_t size = str.size();
    size += size >> 2; // add 25% for possible expansions
    QString result(size, Qt::Uninitialized);

    UErrorCode status = U_ZERO_ERROR;

    size = caseFunc(reinterpret_cast<UChar *>(result.data()), result.size(),
            reinterpret_cast<const UChar *>(str.constData()), str.size(),
            localeID, &status);

    if (U_FAILURE(status) && status != U_BUFFER_OVERFLOW_ERROR)
        return false;

    if (size < result.size()) {
        result.resize(size);
    } else if (size > result.size()) {
        // the resulting string is larger than our source string
        result.resize(size);

        status = U_ZERO_ERROR;
        size = caseFunc(reinterpret_cast<UChar *>(result.data()), result.size(),
            reinterpret_cast<const UChar *>(str.constData()), str.size(),
            localeID, &status);

        if (U_FAILURE(status))
            return false;

        // if the sizes don't match now, we give up.
        if (size != result.size())
            return false;
    }

    *out = result;
    return true;
}